

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genericvar.cpp
# Opt level: O1

void __thiscall MetaSim::GenericVar::readPDF(GenericVar *this,ifstream *f,int mode)

{
  mapped_type *pmVar1;
  ostream *poVar2;
  double *pdVar3;
  Exc *pEVar4;
  int n;
  string errMsg;
  double p;
  double local_110;
  int local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  mapped_type local_c0;
  double local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_110 = 0.0;
  if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) == 0) {
    local_110 = 0.0;
    do {
      std::istream::operator>>((istream *)f,&local_104);
      std::istream::_M_extract<double>((double *)f);
      if (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) == 0) {
        pmVar1 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&this->_pdf,&local_104);
        if ((*pmVar1 != 0.0) || (NAN(*pmVar1))) {
          local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"\n","");
          std::operator+(&local_e0,"Malformed PDF",&local_100);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
          pEVar4 = (Exc *)__cxa_allocate_exception(0x30);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_50,
                     CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_),
                     local_e0._M_string_length +
                     CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_));
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"GenericVar","");
          RandomVar::Exc::Exc(pEVar4,&local_50,&local_70);
          __cxa_throw(pEVar4,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
        }
        local_c0 = local_b8;
        local_110 = local_110 + local_b8;
        pmVar1 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&this->_pdf,&local_104);
        *pmVar1 = local_c0;
      }
    } while (((byte)f[*(long *)(*(long *)f + -0x18) + 0x20] & 2) == 0);
  }
  if (local_110 <= 1.0) {
    if (local_110 < 0.99999999999) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: PDF values sum to ",0x1b);
      poVar2 = std::ostream::_M_insert<double>(local_110);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," < 1\n",5);
      if (mode == 0) {
        pdVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&this->_pdf,&local_104);
      }
      else {
        local_e0._M_dataplus._M_p._0_4_ = 1;
        pdVar3 = std::
                 map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>::
                 operator[](&this->_pdf,(key_type *)&local_e0);
      }
      *pdVar3 = (1.0 - local_110) + *pdVar3;
    }
    return;
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"\n","");
  std::operator+(&local_e0,"Malformed PDF",&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  pEVar4 = (Exc *)__cxa_allocate_exception(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,
             CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_),
             local_e0._M_string_length +
             CONCAT44(local_e0._M_dataplus._M_p._4_4_,local_e0._M_dataplus._M_p._0_4_));
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"GenericVar","");
  RandomVar::Exc::Exc(pEVar4,&local_90,&local_b0);
  __cxa_throw(pEVar4,&RandomVar::Exc::typeinfo,BaseExc::~BaseExc);
}

Assistant:

void GenericVar::readPDF(ifstream &f, int mode)
    {
        int n;
        double p;
        double sum;

        sum = 0;
        while(!f.eof()) {
            f >> n;
            f >> p;
#ifdef __DEBUG__
            cout << n << "\t" << p << "\n";
#endif
            if (!f.eof()) {
                if (_pdf[n] != 0) {
                    string errMsg = Exc::_WRONGPDF + string("\n");
                    throw Exc(errMsg, "GenericVar");
                }
                sum += p;
                _pdf[n] = p;
            }
        }

        if (sum > 1) {
            string errMsg = Exc::_WRONGPDF + string("\n");
            throw Exc(errMsg, "GenericVar");
        }

        if (sum < (1.0 - PDF_ERR)) {
            cerr << "Warning: PDF values sum to " << sum << " < 1\n";
            if (mode == 0) {
                _pdf[n] += (1 - sum);
            } else {
                _pdf[1] += (1 - sum);
            }
        }
    }